

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O0

void adios2::helper::HandshakeReader
               (Comm *comm,size_t *appID,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *fullAddresses,string *name,string *engineName)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t *in_RSI;
  json j;
  vector<char,_std::allocator<char>_> address;
  size_t size;
  FileFStream lockstream;
  FileFStream ipstream;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hash_fn;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ips;
  string engineFilename;
  string engineLockFilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff830;
  string *in_stack_fffffffffffff838;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff840;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff858;
  int in_stack_fffffffffffff874;
  unsigned_long *in_stack_fffffffffffff878;
  Comm *in_stack_fffffffffffff880;
  Comm *in_stack_fffffffffffff898;
  FileFStream *in_stack_fffffffffffff8a0;
  FileFStream *in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffffa52;
  undefined1 in_stack_fffffffffffffa53;
  Mode in_stack_fffffffffffffa54;
  string *in_stack_fffffffffffffa58;
  FileFStream *in_stack_fffffffffffffa60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  string local_d8 [80];
  string local_88 [32];
  string local_68 [88];
  size_t *local_10;
  
  __rhs = local_88;
  local_10 = in_RSI;
  std::operator+(in_stack_fffffffffffff858,(char *)__rhs);
  std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  std::operator+(in_stack_fffffffffffff838,(char *)in_stack_fffffffffffff830);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::operator+(in_stack_fffffffffffff858,(char *)__rhs);
  std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  std::__cxx11::string::~string(local_d8);
  AvailableIpAddresses_abi_cxx11_();
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff840);
  if (bVar1) {
    iVar2 = rand();
    *local_10 = (long)iVar2;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_f0,0);
    sVar3 = std::
            hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    *local_10 = sVar3;
  }
  Comm::BroadcastValue<unsigned_long>
            (in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff874);
  adios2::transport::FileFStream::FileFStream(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  adios2::transport::FileFStream::Open
            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa54,
             (bool)in_stack_fffffffffffffa53,(bool)in_stack_fffffffffffffa52);
  adios2::transport::FileFStream::FileFStream(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  do {
    adios2::transport::FileFStream::Open
              (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,in_stack_fffffffffffffa54,
               (bool)in_stack_fffffffffffffa53,(bool)in_stack_fffffffffffffa52);
    adios2::transport::FileFStream::Close(in_stack_fffffffffffff8f0);
  } while( true );
}

Assistant:

void HandshakeReader(Comm const &comm, size_t &appID, std::vector<std::string> &fullAddresses,
                     const std::string &name, const std::string &engineName)
{
    const std::string engineLockFilename = name + "." + engineName + ".lock";
    const std::string engineFilename = name + "." + engineName;

    auto ips = helper::AvailableIpAddresses();
    if (ips.empty())
    {
        appID = rand();
    }
    else
    {
        std::hash<std::string> hash_fn;
        appID = hash_fn(ips[0]);
    }
    comm.BroadcastValue(appID);

    transport::FileFStream ipstream(comm);
    while (true)
    {
        try
        {
            ipstream.Open(engineFilename, Mode::Read);
            break;
        }
        catch (...)
        {
            std::this_thread::sleep_for(std::chrono::milliseconds(1));
        }
    }

    transport::FileFStream lockstream(comm);
    while (true)
    {
        try
        {
            lockstream.Open(engineLockFilename, Mode::Read);
            lockstream.Close();
        }
        catch (...)
        {
            break;
        }
    }

    auto size = ipstream.GetSize();
    std::vector<char> address(size);
    ipstream.Read(address.data(), size);
    ipstream.Close();
    nlohmann::json j = nlohmann::json::parse(address);
    fullAddresses = j.get<std::vector<std::string>>();
}